

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void anon_unknown.dwarf_13fc48::WriteChannelInfo
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
               vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *channels)

{
  ulong uVar1;
  size_t __dest;
  uchar *puVar2;
  bool bVar3;
  uchar *puVar4;
  char *pcVar5;
  size_t sVar6;
  size_type sVar7;
  void *__src;
  const_reference pvVar8;
  uint local_44;
  uint local_40;
  int ySampling;
  int xSampling;
  int pixelType;
  size_t c_1;
  uchar *p;
  size_t c;
  size_t sz;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *channels_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data_local;
  
  c = 0;
  sz = (size_t)channels;
  channels_local =
       (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        *)data;
  for (p = (uchar *)0x0; puVar2 = p,
      puVar4 = (uchar *)std::
                        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ::size((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                *)sz), puVar2 < puVar4; p = p + 1) {
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)sz,(size_type)p);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    sVar6 = strlen(pcVar5);
    c = sVar6 + c + 0x11;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)channels_local,c + 1);
  c_1 = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)channels_local,0
                          );
  for (_xSampling = 0; uVar1 = _xSampling,
      sVar7 = std::
              vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              ::size((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      *)sz), __dest = c_1, uVar1 < sVar7; _xSampling = _xSampling + 1) {
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)sz,_xSampling);
    __src = (void *)std::__cxx11::string::c_str();
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)sz,_xSampling);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    sVar6 = strlen(pcVar5);
    memcpy((void *)__dest,__src,sVar6);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)sz,_xSampling);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    sVar6 = strlen(pcVar5);
    *(undefined1 *)(sVar6 + c_1) = 0;
    c_1 = (size_t)((undefined1 *)(sVar6 + c_1) + 1);
    pvVar8 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           *)sz,_xSampling);
    ySampling = pvVar8->pixelType;
    pvVar8 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           *)sz,_xSampling);
    local_40 = pvVar8->xSampling;
    pvVar8 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           *)sz,_xSampling);
    local_44 = pvVar8->ySampling;
    bVar3 = IsBigEndian();
    if (bVar3) {
      swap4((uint *)&ySampling);
      swap4(&local_40);
      swap4(&local_44);
    }
    *(int *)c_1 = ySampling;
    c_1 = c_1 + 4;
    pvVar8 = std::
             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           *)sz,_xSampling);
    *(uchar *)c_1 = pvVar8->pLinear;
    *(uint *)(c_1 + 4) = local_40;
    *(uint *)(c_1 + 8) = local_44;
    c_1 = c_1 + 0xc;
  }
  *(undefined1 *)c_1 = 0;
  return;
}

Assistant:

void WriteChannelInfo(std::vector<unsigned char> &data,
                      const std::vector<ChannelInfo> &channels) {

  size_t sz = 0;

  // Calculate total size.
  for (size_t c = 0; c < channels.size(); c++) {
    sz += strlen(channels[c].name.c_str()) + 1; // +1 for \0
    sz += 16;                                   // 4 * int
  }
  data.resize(sz + 1);

  unsigned char *p = &data.at(0);

  for (size_t c = 0; c < channels.size(); c++) {
    memcpy(p, channels[c].name.c_str(), strlen(channels[c].name.c_str()));
    p += strlen(channels[c].name.c_str());
    (*p) = '\0';
    p++;

    int pixelType = channels[c].pixelType;
    int xSampling = channels[c].xSampling;
    int ySampling = channels[c].ySampling;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&pixelType));
      swap4(reinterpret_cast<unsigned int *>(&xSampling));
      swap4(reinterpret_cast<unsigned int *>(&ySampling));
    }

    memcpy(p, &pixelType, sizeof(int));
    p += sizeof(int);

    (*p) = channels[c].pLinear;
    p += 4;

    memcpy(p, &xSampling, sizeof(int));
    p += sizeof(int);

    memcpy(p, &ySampling, sizeof(int));
    p += sizeof(int);
  }

  (*p) = '\0';
}